

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

void __thiscall
gl4cts::DirectStateAccess::Textures::ParameterSetupErrorsTest::Clean(ParameterSetupErrorsTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (this->m_to_2D != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_to_2D);
    this->m_to_2D = 0;
  }
  if (this->m_to_2D_ms != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_to_2D_ms);
    this->m_to_2D_ms = 0;
  }
  if (this->m_to_rectangle != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_to_rectangle);
    this->m_to_rectangle = 0;
  }
  if (this->m_to_invalid != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_to_invalid);
  }
  this->m_to_invalid = 0;
  this->m_pname_invalid = 0;
  do {
    iVar1 = (**(code **)(lVar2 + 0x800))();
  } while (iVar1 != 0);
  return;
}

Assistant:

void ParameterSetupErrorsTest::Clean()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Cleanup. */
	if (m_to_2D)
	{
		gl.deleteTextures(1, &m_to_2D);

		m_to_2D = 0;
	}

	if (m_to_2D_ms)
	{
		gl.deleteTextures(1, &m_to_2D_ms);

		m_to_2D_ms = 0;
	}

	if (m_to_rectangle)
	{
		gl.deleteTextures(1, &m_to_rectangle);

		m_to_rectangle = 0;
	}

	if (m_to_invalid)
	{
		gl.deleteTextures(1, &m_to_invalid);

		m_to_invalid = 0;
	}

	m_to_invalid	= 0;
	m_pname_invalid = 0;

	while (GL_NO_ERROR != gl.getError())
		;
}